

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

time_t ftp_timeleft_accept(Curl_easy *data)

{
  long lVar1;
  time_t tVar2;
  time_t tVar3;
  long lVar4;
  timeval local_20;
  
  lVar1 = (data->set).accepttimeout;
  lVar4 = 60000;
  if (0 < lVar1) {
    lVar4 = lVar1;
  }
  local_20 = curlx_tvnow();
  tVar2 = Curl_timeleft(data,&local_20,false);
  if (tVar2 == 0 || lVar4 <= tVar2) {
    tVar3 = curlx_tvdiff(local_20,(data->progress).t_acceptdata);
    tVar2 = -1;
    if (lVar4 - tVar3 != 0) {
      tVar2 = lVar4 - tVar3;
    }
  }
  return tVar2;
}

Assistant:

static time_t ftp_timeleft_accept(struct Curl_easy *data)
{
  time_t timeout_ms = DEFAULT_ACCEPT_TIMEOUT;
  time_t other;
  struct timeval now;

  if(data->set.accepttimeout > 0)
    timeout_ms = data->set.accepttimeout;

  now = Curl_tvnow();

  /* check if the generic timeout possibly is set shorter */
  other =  Curl_timeleft(data, &now, FALSE);
  if(other && (other < timeout_ms))
    /* note that this also works fine for when other happens to be negative
       due to it already having elapsed */
    timeout_ms = other;
  else {
    /* subtract elapsed time */
    timeout_ms -= Curl_tvdiff(now, data->progress.t_acceptdata);
    if(!timeout_ms)
      /* avoid returning 0 as that means no timeout! */
      return -1;
  }

  return timeout_ms;
}